

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_open(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue obj;
  JSContext *ctx_00;
  FILE *__s;
  size_t sVar1;
  FILE *pFVar2;
  int *piVar3;
  int in_ECX;
  JSContext *in_RDI;
  JSValue JVar4;
  int err;
  FILE *f;
  char *mode;
  char *filename;
  JSValueUnion in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  JSValue in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  BOOL is_popen;
  BOOL close_in_finalizer;
  FILE *f_00;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar4.tag = in_stack_ffffffffffffff90;
  JVar4.u.ptr = in_stack_ffffffffffffff88.ptr;
  ctx_00 = (JSContext *)JS_ToCString((JSContext *)0x1118fb,JVar4);
  if ((ctx_00 != (JSContext *)0x0) &&
     (val1.tag = in_stack_ffffffffffffff90, val1.u.ptr = in_stack_ffffffffffffff88.ptr,
     __s = (FILE *)JS_ToCString((JSContext *)0x111924,val1), __s != (FILE *)0x0)) {
    f_00 = __s;
    sVar1 = strspn((char *)__s,"rwa+b");
    if (*(char *)((long)&__s->_flags + sVar1) == '\0') {
      pFVar2 = fopen((char *)ctx_00,(char *)f_00);
      is_popen = (BOOL)pFVar2;
      close_in_finalizer = (BOOL)((ulong)pFVar2 >> 0x20);
      if (pFVar2 == (FILE *)0x0) {
        piVar3 = __errno_location();
        iVar5 = *piVar3;
      }
      else {
        iVar5 = 0;
      }
      if (2 < in_ECX) {
        obj.u._4_4_ = iVar5;
        obj.u.int32 = in_stack_ffffffffffffffa8;
        obj.tag._0_4_ = is_popen;
        obj.tag._4_4_ = close_in_finalizer;
        js_set_error_object((JSContext *)in_stack_ffffffffffffff98.tag,obj,
                            in_stack_ffffffffffffff98.u._4_4_);
      }
      JS_FreeCString((JSContext *)in_stack_ffffffffffffff98.tag,
                     (char *)in_stack_ffffffffffffff98.u.ptr);
      JS_FreeCString((JSContext *)in_stack_ffffffffffffff98.tag,
                     (char *)in_stack_ffffffffffffff98.u.ptr);
      if (CONCAT44(close_in_finalizer,is_popen) == 0) {
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = 2;
        return _local_10;
      }
      JVar4 = js_new_std_file(ctx_00,f_00,close_in_finalizer,is_popen);
      return JVar4;
    }
    in_stack_ffffffffffffff98 = JS_ThrowTypeError(in_RDI,"invalid file mode");
  }
  JS_FreeCString((JSContext *)in_stack_ffffffffffffff98.tag,(char *)in_stack_ffffffffffffff98.u.ptr)
  ;
  JS_FreeCString((JSContext *)in_stack_ffffffffffffff98.tag,(char *)in_stack_ffffffffffffff98.u.ptr)
  ;
  local_10.ptr = (void *)(local_10 << 0x20);
  local_8 = 6;
  return _local_10;
}

Assistant:

static JSValue js_std_open(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *filename, *mode = NULL;
    FILE *f;
    int err;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        goto fail;
    mode = JS_ToCString(ctx, argv[1]);
    if (!mode)
        goto fail;
    if (mode[strspn(mode, "rwa+b")] != '\0') {
        JS_ThrowTypeError(ctx, "invalid file mode");
        goto fail;
    }

    f = fopen(filename, mode);
    if (!f)
        err = errno;
    else
        err = 0;
    if (argc >= 3)
        js_set_error_object(ctx, argv[2], err);
    JS_FreeCString(ctx, filename);
    JS_FreeCString(ctx, mode);
    if (!f)
        return JS_NULL;
    return js_new_std_file(ctx, f, TRUE, FALSE);
 fail:
    JS_FreeCString(ctx, filename);
    JS_FreeCString(ctx, mode);
    return JS_EXCEPTION;
}